

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O1

IterateResult __thiscall
glcts::MultisampleTextureDependenciesNoErrorGeneratedForValidFramebufferTexture2DCallsTest::iterate
          (MultisampleTextureDependenciesNoErrorGeneratedForValidFramebufferTexture2DCallsTest *this
          )

{
  GLuint *pGVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  undefined4 uVar5;
  long lVar6;
  GLint gl_max_internalformat_samples;
  int local_3c;
  MultisampleTextureDependenciesNoErrorGeneratedForValidFramebufferTexture2DCallsTest *local_38;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  initInternals(this);
  local_3c = 0;
  pGVar1 = &this->to_id;
  lVar6 = 0;
  local_38 = this;
  do {
    uVar5 = *(undefined4 *)((long)&DAT_01b63ad0 + lVar6);
    (**(code **)(lVar4 + 0x880))(0x9100,uVar5,0x80a9,1,&local_3c);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,
                    "Could not retrieve maximum supported amount of samples for internal format",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                    ,0x819);
    iVar2 = local_3c;
    if (1 < local_3c) {
      (**(code **)(lVar4 + 0x6f8))(1,pGVar1);
      (**(code **)(lVar4 + 0xb8))(0x9100,*pGVar1);
      (**(code **)(lVar4 + 0x1390))(0x9100,iVar2,uVar5,1,1,0);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Could not set up a texture object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                      ,0x82b);
      uVar5 = 0x8ce0;
      if (lVar6 == 0x10) {
        uVar5 = 0x821a;
      }
      if (lVar6 == 0xc) {
        uVar5 = 0x8d00;
      }
      (**(code **)(lVar4 + 0x6a0))(0x8ca9,uVar5,0x9100,*pGVar1,0);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glFramebufferTexture2D() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                      ,0x83c);
      (**(code **)(lVar4 + 0xb8))(0x9100,0);
      (**(code **)(lVar4 + 0x480))(1,pGVar1);
      *pGVar1 = 0;
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Could not release the texture object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                      ,0x844);
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x18);
  tcu::TestContext::setTestResult
            ((local_38->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureDependenciesNoErrorGeneratedForValidFramebufferTexture2DCallsTest::
	iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* For storing format specific maximum number of samples */
	glw::GLint gl_max_internalformat_samples = 0;

	/* Iterate through all internalformats */
	const glw::GLenum internalformats[] = {
		GL_RGB8, GL_RGB565, GL_SRGB8_ALPHA8, GL_DEPTH_COMPONENT32F, GL_DEPTH24_STENCIL8, GL_RGBA32I
	};
	const unsigned int n_internalformats = sizeof(internalformats) / sizeof(internalformats[0]);

	for (unsigned int n_internalformat = 0; n_internalformat < n_internalformats; ++n_internalformat)
	{
		glw::GLenum internalformat = internalformats[n_internalformat];

		/* Determine a value to be used for samples argument in subsequent
		 * glTexStorage2DMultisample() call. */
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, internalformat, GL_SAMPLES, 1,
							   &gl_max_internalformat_samples);

		GLU_EXPECT_NO_ERROR(gl.getError(),
							"Could not retrieve maximum supported amount of samples for internal format");

		glw::GLint samples = gl_max_internalformat_samples;

		/* Skip formats that are not multisampled in implementation */
		if (samples <= 1)
		{
			continue;
		}

		/* Set up a texture object. */
		gl.genTextures(1, &to_id);
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id);

		gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, samples, internalformat, 1, /* width */
								   1,													  /* height */
								   GL_FALSE);											  /* fixedsamplelocations */

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a texture object");

		/* Determine attachment type for internalformat considered */
		glw::GLenum attachment_type = GL_COLOR_ATTACHMENT0;

		if (internalformat == GL_DEPTH_COMPONENT32F)
		{
			attachment_type = GL_DEPTH_ATTACHMENT;
		}
		else if (internalformat == GL_DEPTH24_STENCIL8)
		{
			attachment_type = GL_DEPTH_STENCIL_ATTACHMENT;
		}

		/* Attach it to the FBO */
		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, attachment_type, GL_TEXTURE_2D_MULTISAMPLE, to_id, 0); /* level */

		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

		/* Release the texture object */
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);
		gl.deleteTextures(1, &to_id);

		to_id = 0;

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not release the texture object");
	} /* for (all internalformats) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}